

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xoshiro256plus.cc
# Opt level: O0

void __thiscall
trng::xoshiro256plus::seed
          (xoshiro256plus *this,result_type s0,result_type s1,result_type s2,result_type s3)

{
  result_type s3_local;
  result_type s2_local;
  result_type s1_local;
  result_type s0_local;
  xoshiro256plus *this_local;
  
  (this->S).r[0] = s0;
  (this->S).r[1] = s1;
  (this->S).r[2] = s2;
  (this->S).r[3] = s3;
  if (((((this->S).r[0] == 0) && ((this->S).r[1] == 0)) && ((this->S).r[2] == 0)) &&
     ((this->S).r[3] == 0)) {
    (this->S).r[0] = (this->S).r[0] | 0x8000000000000000;
  }
  return;
}

Assistant:

void xoshiro256plus::seed(result_type s0, result_type s1, result_type s2, result_type s3) {
    S.r[0] = static_cast<result_type>(s0);
    S.r[1] = static_cast<result_type>(s1);
    S.r[2] = static_cast<result_type>(s2);
    S.r[3] = static_cast<result_type>(s3);
    if (S.r[0] == 0 and S.r[1] == 0 and S.r[2] == 0 and S.r[3] == 0)
      S.r[0] |= result_type(1) << 63u;
  }